

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O2

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadBoneAssignment(OgreBinarySerializer *this,VertexData *dest)

{
  DeadlyImportError *this_00;
  undefined2 extraout_AX;
  undefined2 extraout_var;
  undefined4 extraout_var_00;
  allocator local_41;
  VertexBoneAssignment ba;
  
  if (dest != (VertexData *)0x0) {
    ba.vertexIndex = Read<unsigned_int>(this);
    ba.boneIndex = Read<unsigned_short>(this);
    ba.weight = Read<float>(this);
    std::
    vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
    ::push_back(&(dest->super_IVertexData).boneAssignments,&ba);
    return;
  }
  __cxa_allocate_exception(0x10);
  this_00 = (DeadlyImportError *)CONCAT44(extraout_var_00,CONCAT22(extraout_var,extraout_AX));
  std::__cxx11::string::string
            ((string *)&ba,"Cannot read bone assignments, vertex data is null.",&local_41);
  DeadlyImportError::DeadlyImportError(this_00,(string *)&ba);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OgreBinarySerializer::ReadBoneAssignment(VertexData *dest)
{
    if (!dest) {
        throw DeadlyImportError("Cannot read bone assignments, vertex data is null.");
    }

    VertexBoneAssignment ba;
    ba.vertexIndex = Read<uint32_t>();
    ba.boneIndex = Read<uint16_t>();
    ba.weight = Read<float>();

    dest->boneAssignments.push_back(ba);
}